

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O1

void __thiscall vox::nGRP::nGRP(nGRP *this,int32_t vCount)

{
  ulong in_RAX;
  iterator __position;
  undefined8 uStack_28;
  
  (this->nodeAttribs).keys.super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodeAttribs).keys.super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodeAttribs).keys.super__Vector_base<vox::DICTitem,_std::allocator<vox::DICTitem>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodeAttribs).count = 0;
  (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->nodeId = 0;
  this->nodeChildrenNodes = vCount;
  __position._M_current =
       (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((int)((ulong)__position._M_current >> 2) < vCount) {
    uStack_28 = in_RAX;
    do {
      uStack_28 = uStack_28 & 0xffffffff;
      if (__position._M_current ==
          (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&this->childNodes,__position,(int *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = 0;
        (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __position._M_current =
           (this->childNodes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
    } while ((int)((ulong)((long)__position._M_current -
                          (long)(this->childNodes).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2) <
             this->nodeChildrenNodes);
  }
  return;
}

Assistant:

nGRP::nGRP(int32_t vCount) {
    nodeId            = 0;
    nodeChildrenNodes = vCount;
    while ((int32_t)childNodes.size() < nodeChildrenNodes)
        childNodes.push_back(0);
}